

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

ELzmaDummy LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,SizeT inSize)

{
  byte *pbVar1;
  bool bVar2;
  uint symbol;
  uint uVar3;
  ELzmaDummy EVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  ELzmaDummy EVar9;
  SizeT SVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  UInt16 *pUVar14;
  uint i;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ELzmaDummy EVar19;
  
  uVar15 = p->range;
  uVar11 = p->code;
  pbVar1 = buf + inSize;
  pUVar14 = p->probs;
  uVar3 = p->state;
  uVar17 = p->processedPos;
  uVar18 = ~(-1 << ((byte)(p->prop).pb & 0x1f)) & uVar17;
  if (uVar15 < 0x1000000) {
    if ((long)inSize < 1) {
LAB_0070e418:
      EVar9 = (ELzmaDummy)inSize;
      bVar2 = false;
      EVar19 = DUMMY_ERROR;
      goto LAB_0070e76f;
    }
    uVar15 = uVar15 << 8;
    bVar6 = *buf;
    buf = buf + 1;
    uVar11 = uVar11 << 8 | (uint)bVar6;
  }
  uVar16 = (uVar15 >> 0xb) * (uint)pUVar14[(ulong)(uVar3 << 4) + (ulong)uVar18];
  uVar7 = uVar11 - uVar16;
  if (uVar11 < uVar16) {
    pUVar14 = pUVar14 + 0x736;
    if (p->checkDicSize != 0 || uVar17 != 0) {
      bVar6 = (byte)(p->prop).lc;
      SVar10 = p->dicPos;
      if (SVar10 == 0) {
        SVar10 = p->dicBufSize;
      }
      pUVar14 = pUVar14 + ((uint)(p->dic[SVar10 - 1] >> (8 - bVar6 & 0x1f)) +
                          ((uVar17 & ~(-1 << ((byte)(p->prop).lp & 0x1f))) << (bVar6 & 0x1f))) *
                          0x300;
    }
    if (uVar3 < 7) {
      uVar5 = 1;
      do {
        if (uVar16 < 0x1000000) {
          if (pbVar1 <= buf) {
            bVar2 = false;
            uVar15 = uVar16;
            goto joined_r0x0070e40f;
          }
          uVar16 = uVar16 << 8;
          bVar6 = *buf;
          buf = buf + 1;
          uVar11 = uVar11 << 8 | (uint)bVar6;
        }
        uVar15 = (uVar16 >> 0xb) * (uint)pUVar14[uVar5];
        if (uVar11 < uVar15) {
          uVar3 = (int)uVar5 * 2;
          uVar16 = uVar15;
        }
        else {
          uVar16 = uVar16 - uVar15;
          uVar3 = (int)uVar5 * 2 + 1;
          uVar11 = uVar11 - uVar15;
        }
        uVar5 = (ulong)uVar3;
      } while (uVar3 < 0x100);
      bVar2 = true;
      uVar15 = uVar16;
    }
    else {
      if (p->dicPos < (ulong)p->reps[0]) {
        SVar10 = p->dicBufSize;
      }
      else {
        SVar10 = 0;
      }
      uVar17 = (uint)p->dic[SVar10 + (p->dicPos - (ulong)p->reps[0])];
      uVar3 = 1;
      inSize = 0x100;
      uVar15 = uVar16;
      do {
        uVar17 = uVar17 * 2;
        uVar18 = uVar17 & (uint)inSize;
        if (uVar15 < 0x1000000) {
          if (buf < pbVar1) {
            uVar15 = uVar15 << 8;
            bVar6 = *buf;
            buf = buf + 1;
            uVar11 = uVar11 << 8 | (uint)bVar6;
            goto LAB_0070e3c2;
          }
          bVar2 = false;
        }
        else {
LAB_0070e3c2:
          uVar7 = (uVar15 >> 0xb) * (uint)pUVar14[inSize + (ulong)uVar18 + (ulong)uVar3];
          uVar16 = uVar11 - uVar7;
          if (uVar11 < uVar7) {
            uVar3 = uVar3 * 2;
            inSize = (ulong)(uVar18 ^ (uint)inSize);
            uVar15 = uVar7;
            uVar16 = uVar11;
          }
          else {
            uVar15 = uVar15 - uVar7;
            uVar3 = uVar3 * 2 + 1;
            inSize = (ulong)uVar18;
          }
          bVar2 = true;
          uVar11 = uVar16;
        }
        if (!bVar2) goto LAB_0070e418;
      } while (uVar3 < 0x100);
    }
joined_r0x0070e40f:
    if (!bVar2) {
      EVar19 = DUMMY_ERROR;
      EVar9 = DUMMY_LIT;
      bVar2 = false;
      goto LAB_0070e76f;
    }
    EVar19 = DUMMY_ERROR;
    EVar9 = DUMMY_LIT;
  }
  else {
    uVar15 = uVar15 - uVar16;
    EVar9 = (ELzmaDummy)pUVar14[(ulong)uVar3 + 0xc0];
    if (uVar15 < 0x1000000) {
      if (buf < pbVar1) {
        uVar15 = uVar15 * 0x100;
        bVar6 = *buf;
        buf = buf + 1;
        uVar7 = uVar7 * 0x100 | (uint)bVar6;
        goto LAB_0070e237;
      }
LAB_0070e75f:
      bVar2 = false;
      EVar19 = DUMMY_ERROR;
    }
    else {
LAB_0070e237:
      uVar17 = (uVar15 >> 0xb) * (uint)pUVar14[(ulong)uVar3 + 0xc0];
      uVar11 = uVar7 - uVar17;
      if (uVar7 < uVar17) {
        EVar9 = DUMMY_MATCH;
        lVar12 = 0x664;
        uVar16 = uVar7;
        uVar11 = uVar17;
        goto LAB_0070e258;
      }
      uVar15 = uVar15 - uVar17;
      if (uVar15 < 0x1000000) {
        uVar13 = uVar15;
        if (buf < pbVar1) {
          uVar15 = uVar15 * 0x100;
          bVar6 = *buf;
          buf = buf + 1;
          uVar11 = uVar11 * 0x100 | (uint)bVar6;
          goto LAB_0070e2d0;
        }
LAB_0070e4c6:
        EVar9 = DUMMY_REP;
        uVar15 = uVar13;
        goto LAB_0070e75f;
      }
LAB_0070e2d0:
      uVar13 = (uVar15 >> 0xb) * (uint)pUVar14[(ulong)uVar3 + 0xcc];
      uVar16 = uVar11 - uVar13;
      if (uVar11 < uVar13) {
        if (uVar13 < 0x1000000) {
          if (pbVar1 <= buf) goto LAB_0070e4c6;
          uVar13 = uVar13 * 0x100;
          bVar6 = *buf;
          buf = buf + 1;
          uVar11 = uVar11 << 8 | (uint)bVar6;
        }
        uVar15 = (uVar13 >> 0xb) * (uint)pUVar14[(ulong)(uVar3 << 4) + (ulong)uVar18 + 0xf0];
        if (uVar15 <= uVar11) {
          EVar9 = DUMMY_REP;
          lVar12 = 0xa68;
          uVar16 = uVar11 - uVar15;
          uVar11 = uVar13 - uVar15;
          goto LAB_0070e258;
        }
        EVar9 = DUMMY_REP;
        if (0xffffff < uVar15) {
LAB_0070e339:
          bVar2 = false;
          EVar19 = DUMMY_REP;
          goto LAB_0070e762;
        }
        if (buf < pbVar1) {
          uVar15 = uVar15 * 0x100;
          buf = buf + 1;
          goto LAB_0070e339;
        }
      }
      else {
        uVar15 = uVar15 - uVar13;
        if (uVar15 < 0x1000000) {
          if (pbVar1 <= buf) {
            EVar9 = DUMMY_REP;
            goto LAB_0070e75f;
          }
          uVar15 = uVar15 * 0x100;
          bVar6 = *buf;
          buf = buf + 1;
          uVar16 = uVar16 * 0x100 | (uint)bVar6;
        }
        uVar11 = (uVar15 >> 0xb) * (uint)pUVar14[(ulong)uVar3 + 0xd8];
        EVar9 = DUMMY_REP;
        lVar12 = 0xa68;
        uVar13 = uVar16 - uVar11;
        if (uVar11 <= uVar16) {
          uVar15 = uVar15 - uVar11;
          if (uVar15 < 0x1000000) {
            if (pbVar1 <= buf) goto LAB_0070e75f;
            uVar15 = uVar15 * 0x100;
            bVar6 = *buf;
            buf = buf + 1;
            uVar13 = uVar13 * 0x100 | (uint)bVar6;
          }
          uVar3 = (uVar15 >> 0xb) * (uint)pUVar14[(ulong)uVar3 + 0xe4];
          uVar16 = uVar13;
          uVar11 = uVar3;
          if (uVar3 <= uVar13) {
            uVar16 = uVar13 - uVar3;
            uVar11 = uVar15 - uVar3;
          }
        }
LAB_0070e258:
        if (uVar11 < 0x1000000) {
          uVar13 = uVar16;
          if (buf < pbVar1) {
            uVar11 = uVar11 << 8;
            bVar6 = *buf;
            buf = buf + 1;
            uVar16 = (uint)bVar6 | uVar16 << 8;
            goto LAB_0070e349;
          }
LAB_0070e455:
          bVar2 = false;
          uVar15 = uVar11;
        }
        else {
LAB_0070e349:
          uVar15 = (uVar11 >> 0xb) * (uint)*(ushort *)((long)pUVar14 + lVar12);
          uVar13 = uVar16 - uVar15;
          if (uVar16 < uVar15) {
            lVar12 = (long)pUVar14 + (ulong)(uVar18 << 3) * 2 + lVar12 + 4;
            iVar8 = 0;
            uVar11 = 8;
          }
          else {
            uVar11 = uVar11 - uVar15;
            if (uVar11 < 0x1000000) {
              if (pbVar1 <= buf) goto LAB_0070e455;
              uVar11 = uVar11 * 0x100;
              bVar6 = *buf;
              buf = buf + 1;
              uVar13 = (uint)bVar6 | uVar13 * 0x100;
            }
            uVar15 = (uVar11 >> 0xb) * (uint)*(ushort *)((long)pUVar14 + lVar12 + 2);
            uVar16 = uVar13 - uVar15;
            if (uVar13 < uVar15) {
              lVar12 = (long)pUVar14 + (ulong)(uVar18 << 3) * 2 + lVar12 + 0x104;
              uVar11 = 8;
              iVar8 = 8;
              uVar16 = uVar13;
            }
            else {
              uVar15 = uVar11 - uVar15;
              lVar12 = (long)pUVar14 + lVar12 + 0x204;
              iVar8 = 0x10;
              uVar11 = 0x100;
            }
          }
          uVar5 = 1;
          uVar13 = uVar16;
          do {
            uVar3 = (uint)uVar5;
            if (uVar15 < 0x1000000) {
              if (pbVar1 <= buf) {
                bVar2 = false;
                goto LAB_0070e58b;
              }
              uVar15 = uVar15 << 8;
              bVar6 = *buf;
              buf = buf + 1;
              uVar13 = uVar13 << 8 | (uint)bVar6;
            }
            uVar18 = (uVar15 >> 0xb) * (uint)*(ushort *)(lVar12 + uVar5 * 2);
            uVar16 = uVar13 - uVar18;
            if (uVar13 < uVar18) {
              uVar3 = uVar3 * 2;
            }
            else {
              uVar18 = uVar15 - uVar18;
              uVar3 = uVar3 * 2 + 1;
              uVar13 = uVar16;
            }
            uVar5 = (ulong)uVar3;
            uVar15 = uVar18;
          } while (uVar3 < uVar11);
          uVar3 = (iVar8 - uVar11) + uVar3;
          bVar2 = true;
        }
LAB_0070e58b:
        EVar19 = DUMMY_ERROR;
        if (bVar2) {
          bVar2 = true;
          if (uVar7 < uVar17) {
            uVar11 = 3;
            if (uVar3 < 3) {
              uVar11 = uVar3;
            }
            uVar3 = 1;
            uVar17 = uVar15;
            do {
              if (uVar17 < 0x1000000) {
                uVar15 = uVar17;
                if (pbVar1 <= buf) goto LAB_0070e75f;
                uVar17 = uVar17 << 8;
                bVar6 = *buf;
                buf = buf + 1;
                uVar13 = uVar13 << 8 | (uint)bVar6;
              }
              uVar15 = (uVar17 >> 0xb) *
                       (uint)*(ushort *)
                              ((long)pUVar14 + (ulong)uVar3 * 2 + (ulong)(uVar11 << 7) + 0x360);
              uVar18 = uVar13 - uVar15;
              if (uVar13 < uVar15) {
                uVar3 = uVar3 * 2;
              }
              else {
                uVar15 = uVar17 - uVar15;
                uVar3 = uVar3 * 2 + 1;
                uVar13 = uVar18;
              }
              uVar17 = uVar15;
            } while (uVar3 < 0x40);
            uVar11 = uVar3 - 0x40;
            if (3 < uVar11) {
              if (uVar11 < 0xe) {
                iVar8 = (uVar11 >> 1) - 1;
                pUVar14 = pUVar14 + (ulong)((uVar3 & 1 | 2) << ((byte)iVar8 & 0x1f)) +
                                    (0x2af - (ulong)uVar11);
              }
              else {
                iVar8 = (uVar11 >> 1) - 5;
                do {
                  if (uVar15 < 0x1000000) {
                    if (pbVar1 <= buf) goto LAB_0070e75f;
                    uVar15 = uVar15 << 8;
                    bVar6 = *buf;
                    buf = buf + 1;
                    uVar13 = uVar13 << 8 | (uint)bVar6;
                  }
                  uVar15 = uVar15 >> 1;
                  uVar11 = 0;
                  if (-1 < (int)(uVar13 - uVar15)) {
                    uVar11 = uVar15;
                  }
                  uVar13 = uVar13 - uVar11;
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
                pUVar14 = pUVar14 + 0x322;
                iVar8 = 4;
              }
              uVar11 = 1;
              uVar3 = uVar15;
              do {
                if (uVar3 < 0x1000000) {
                  uVar15 = uVar3;
                  if (pbVar1 <= buf) goto LAB_0070e75f;
                  uVar3 = uVar3 << 8;
                  bVar6 = *buf;
                  buf = buf + 1;
                  uVar13 = uVar13 << 8 | (uint)bVar6;
                }
                uVar15 = (uVar3 >> 0xb) * (uint)pUVar14[uVar11];
                uVar17 = uVar13 - uVar15;
                if (uVar13 < uVar15) {
                  uVar11 = uVar11 * 2;
                }
                else {
                  uVar15 = uVar3 - uVar15;
                  uVar11 = uVar11 * 2 + 1;
                  uVar13 = uVar17;
                }
                iVar8 = iVar8 + -1;
                uVar3 = uVar15;
              } while (iVar8 != 0);
            }
          }
          goto LAB_0070e762;
        }
      }
      EVar19 = DUMMY_ERROR;
      bVar2 = false;
    }
LAB_0070e762:
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0070e76f;
    }
  }
  bVar2 = true;
LAB_0070e76f:
  EVar4 = DUMMY_ERROR;
  if (buf < pbVar1) {
    EVar4 = EVar9;
  }
  if (0xffffff < uVar15) {
    EVar4 = EVar9;
  }
  if (!bVar2) {
    EVar4 = EVar19;
  }
  return EVar4;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec *p, const Byte *buf, SizeT inSize)
{
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte *bufLimit = buf + inSize;
  const CLzmaProb *probs = p->probs;
  unsigned state = p->state;
  ELzmaDummy res;

  {
    const CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = (p->processedPos) & ((1 << p->prop.pb) - 1);

    prob = probs + IsMatch + (state << kNumPosBitsMax) + posState;
    IF_BIT_0_CHECK(prob)
    {
      UPDATE_0_CHECK

      /* if (bufLimit - buf >= 7) return DUMMY_LIT; */

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += ((UInt32)LZMA_LIT_SIZE *
            ((((p->processedPos) & ((1 << (p->prop.lp)) - 1)) << p->prop.lc) +
            (p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates)
      {
        unsigned symbol = 1;
        do { GET_BIT_CHECK(prob + symbol, symbol) } while (symbol < 0x100);
      }
      else
      {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
            (p->dicPos < p->reps[0] ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do
        {
          unsigned bit;
          const CLzmaProb *probLit;
          matchByte <<= 1;
          bit = (matchByte & offs);
          probLit = prob + offs + bit + symbol;
          GET_BIT2_CHECK(probLit, symbol, offs &= ~bit, offs &= bit)
        }
        while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else
    {
      unsigned len;
      UPDATE_1_CHECK;

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob)
      {
        UPDATE_0_CHECK;
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else
      {
        UPDATE_1_CHECK;
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob)
        {
          UPDATE_0_CHECK;
          prob = probs + IsRep0Long + (state << kNumPosBitsMax) + posState;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK;
            NORMALIZE_CHECK;
            return DUMMY_REP;
          }
          else
          {
            UPDATE_1_CHECK;
          }
        }
        else
        {
          UPDATE_1_CHECK;
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK;
          }
          else
          {
            UPDATE_1_CHECK;
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob)
            {
              UPDATE_0_CHECK;
            }
            else
            {
              UPDATE_1_CHECK;
            }
          }